

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamDataSignalEmissions(QNetworkReplyImplPrivate *this)

{
  QByteArrayView defaultValue;
  QNetworkReplyImpl *__u;
  ulong uVar1;
  long lVar2;
  qint64 qVar3;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  optional<long_long> oVar5;
  QNetworkReplyImpl *q;
  optional<long_long> totalSizeOpt;
  QNetworkHeadersPrivate *in_stack_ffffffffffffff88;
  optional<long_long> *this_00;
  QHttpHeaders *in_stack_ffffffffffffffa8;
  QNetworkReplyImplPrivate *pQVar6;
  undefined4 in_stack_ffffffffffffffc8;
  InternalNotifications in_stack_ffffffffffffffcc;
  QByteArrayView local_30;
  _Storage<long_long,_true> local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  __u = q_func(in_RDI);
  local_18 = (_Storage<long_long,_true>)0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QNetworkHeadersPrivate::headers(in_stack_ffffffffffffff88);
  QByteArrayView::QByteArrayView(&local_30);
  defaultValue.m_data._0_4_ = in_stack_ffffffffffffffc8;
  defaultValue.m_size = (qsizetype)pQVar6;
  defaultValue.m_data._4_4_ = in_stack_ffffffffffffffcc;
  QVar4 = QHttpHeaders::value(in_stack_ffffffffffffffa8,(WellKnownHeader)((ulong)in_RDI >> 0x20),
                              defaultValue);
  pQVar6 = (QNetworkReplyImplPrivate *)QVar4.m_data;
  QVar4.m_data = (storage_type *)__u;
  QVar4.m_size = (qsizetype)pQVar6;
  oVar5 = QNetworkHeadersPrivate::toInt(QVar4);
  local_18._M_value =
       oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  local_10 = CONCAT71(local_10._1_7_,
                      oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
                      super__Optional_payload_base<long_long>._M_engaged);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x1ebc7c);
  pauseNotificationHandling(in_RDI);
  QIODevice::readyRead();
  uVar1 = QElapsedTimer::isValid();
  if (((uVar1 & 1) != 0) && (lVar2 = QElapsedTimer::elapsed(), 99 < lVar2)) {
    QElapsedTimer::start();
    this_00 = (optional<long_long> *)in_RDI->bytesDownloaded;
    in_stack_ffffffffffffffcc = ~NotifyDownstreamReadyWrite;
    std::optional<long_long>::value_or<int>(this_00,(int *)__u);
    QNetworkReply::downloadProgress
              ((QNetworkReply *)in_stack_ffffffffffffff88,(qint64)this_00,(qint64)__u);
  }
  resumeNotificationHandling(in_RDI);
  qVar3 = nextDownstreamBlockSize(in_RDI);
  if (0 < qVar3) {
    backendNotify(pQVar6,in_stack_ffffffffffffffcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamDataSignalEmissions()
{
    Q_Q(QNetworkReplyImpl);

    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
    pauseNotificationHandling();
    // important: At the point of this readyRead(), the data parameter list must be empty,
    // else implicit sharing will trigger memcpy when the user is reading data!
    emit q->readyRead();
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, totalSizeOpt.value_or(-1));
    }

    resumeNotificationHandling();
    // do we still have room in the buffer?
    if (nextDownstreamBlockSize() > 0)
        backendNotify(QNetworkReplyImplPrivate::NotifyDownstreamReadyWrite);
}